

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapLookupIntKey(jx9_hashmap *pMap,sxi64 iKey,jx9_hashmap_node **ppNode)

{
  sxu32 sVar1;
  jx9_hashmap_node *pjStack_30;
  sxu32 nHash;
  jx9_hashmap_node *pNode;
  jx9_hashmap_node **ppNode_local;
  sxi64 iKey_local;
  jx9_hashmap *pMap_local;
  
  if (pMap->nEntry != 0) {
    sVar1 = (*pMap->xIntHash)(iKey);
    for (pjStack_30 = pMap->apBucket[sVar1 & pMap->nSize - 1]; pjStack_30 != (jx9_hashmap_node *)0x0
        ; pjStack_30 = pjStack_30->pNextCollide) {
      if (((pjStack_30->iType == 1) && (pjStack_30->nHash == sVar1)) &&
         ((pjStack_30->xKey).iKey == iKey)) {
        if (ppNode != (jx9_hashmap_node **)0x0) {
          *ppNode = pjStack_30;
        }
        return 0;
      }
    }
  }
  return -6;
}

Assistant:

static sxi32 HashmapLookupIntKey(
	jx9_hashmap *pMap,         /* Target hashmap */
	sxi64 iKey,                /* lookup key */
	jx9_hashmap_node **ppNode  /* OUT: target node on success */
	)
{
	jx9_hashmap_node *pNode;
	sxu32 nHash;
	if( pMap->nEntry < 1 ){
		/* Don't bother hashing, there is no entry anyway */
		return SXERR_NOTFOUND;
	}
	/* Hash the key first */
	nHash = pMap->xIntHash(iKey);
	/* Point to the appropriate bucket */
	pNode = pMap->apBucket[nHash & (pMap->nSize - 1)];
	/* Perform the lookup */
	for(;;){
		if( pNode == 0 ){
			break;
		}
		if( pNode->iType == HASHMAP_INT_NODE
			&& pNode->nHash == nHash
			&& pNode->xKey.iKey == iKey ){
				/* Node found */
				if( ppNode ){
					*ppNode = pNode;
				}
				return SXRET_OK;
		}
		/* Follow the collision link */
		pNode = pNode->pNextCollide;
	}
	/* No such entry */
	return SXERR_NOTFOUND;
}